

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ClipLayerParams::SerializeWithCachedSizes
          (ClipLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  
  fVar1 = this->minval_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar1,output);
  }
  fVar1 = this->maxval_;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  return;
}

Assistant:

void ClipLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ClipLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float minVal = 1;
  if (this->minval() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->minval(), output);
  }

  // float maxVal = 2;
  if (this->maxval() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->maxval(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ClipLayerParams)
}